

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O1

void __thiscall
booster::aio::stream_socket::async_read(stream_socket *this,mutable_buffer *buffer,io_handler *h)

{
  long buffer_00;
  callable<void_(const_std::error_code_&,_unsigned_long)> *pcVar1;
  void *pvVar2;
  basic_io_device *this_00;
  char *pcVar3;
  _func_int ***this_01;
  bool bVar4;
  pointer_type pVar5;
  size_t n;
  io_service *this_02;
  pointer r;
  error_code e;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> local_80;
  intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all> local_78;
  mutable_buffer local_70;
  error_code local_40;
  
  bVar4 = basic_io_device::dont_block((basic_io_device *)this,h);
  if (bVar4) {
    pVar5.p_ = (callable<void_(const_std::error_code_&)> *)operator_new(0x58);
    ((pVar5.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__refcounted_001cfeb0;
    this_01 = (_func_int ***)&((pVar5.p_)->super_refcounted).refs_;
    atomic_counter::atomic_counter((atomic_counter *)this_01,0);
    ((pVar5.p_)->super_refcounted)._vptr_refcounted = (_func_int **)&PTR__reader_all_001d0380;
    pcVar3 = (buffer->super_buffer_impl<char_*>).entry_.ptr;
    *(undefined8 *)(pVar5.p_ + 1) = *(undefined8 *)&buffer->super_buffer_impl<char_*>;
    *(char **)((long)(pVar5.p_ + 1) + 8) = pcVar3;
    *(size_t *)(pVar5.p_ + 2) = (buffer->super_buffer_impl<char_*>).entry_.size;
    std::
    vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ::vector((vector<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
              *)((long)(pVar5.p_ + 2) + 8),&(buffer->super_buffer_impl<char_*>).vec_);
    *(undefined8 *)(pVar5.p_ + 4) = 0;
    *(stream_socket **)((long)(pVar5.p_ + 4) + 8) = this;
    pcVar1 = (h->call_ptr).p_;
    *(callable<void_(const_std::error_code_&,_unsigned_long)> **)(pVar5.p_ + 5) = pcVar1;
    if (pcVar1 != (callable<void_(const_std::error_code_&,_unsigned_long)> *)0x0) {
      atomic_counter::inc((atomic_counter *)(pcVar1 + 8));
    }
    buffer_00 = (long)(pVar5.p_ + 1);
    local_80.p_ = (reader_all *)pVar5.p_;
    atomic_counter::inc((atomic_counter *)this_01);
    local_40._M_value = 0;
    local_40._M_cat = (error_category *)std::_V2::system_category();
    n = read_some(*(stream_socket **)((long)(pVar5.p_ + 4) + 8),(mutable_buffer *)buffer_00,
                  &local_40);
    *(size_t *)(pVar5.p_ + 4) = *(long *)(pVar5.p_ + 4) + n;
    details::advance<booster::aio::mutable_buffer>(&local_70,(mutable_buffer *)buffer_00,n);
    *(size_t *)(pVar5.p_ + 2) = local_70.super_buffer_impl<char_*>.entry_.size;
    *(undefined8 *)buffer_00 = local_70.super_buffer_impl<char_*>._0_8_;
    *(char **)((long)(pVar5.p_ + 1) + 8) = local_70.super_buffer_impl<char_*>.entry_.ptr;
    pvVar2 = *(void **)((long)(pVar5.p_ + 2) + 8);
    *(pointer *)((long)(pVar5.p_ + 2) + 8) =
         local_70.super_buffer_impl<char_*>.vec_.
         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(pointer *)(pVar5.p_ + 3) =
         local_70.super_buffer_impl<char_*>.vec_.
         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    *(pointer *)((long)(pVar5.p_ + 3) + 8) =
         local_70.super_buffer_impl<char_*>.vec_.
         super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_70.super_buffer_impl<char_*>.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70.super_buffer_impl<char_*>.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_70.super_buffer_impl<char_*>.vec_.
    super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2);
    }
    if (local_70.super_buffer_impl<char_*>.vec_.
        super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super_buffer_impl<char_*>.vec_.
                      super__Vector_base<booster::aio::buffer_impl<char_*>::entry,_std::allocator<booster::aio::buffer_impl<char_*>::entry>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((*(int *)buffer_00 == 0) ||
       ((local_40._M_value != 0 && (bVar4 = basic_io_device::would_block(&local_40), !bVar4)))) {
      this_02 = basic_io_device::get_io_service(*(basic_io_device **)((long)(pVar5.p_ + 4) + 8));
      io_service::post(this_02,(io_handler *)(pVar5.p_ + 5),&local_40,*(size_t *)(pVar5.p_ + 4));
    }
    else {
      this_00 = *(basic_io_device **)((long)(pVar5.p_ + 4) + 8);
      local_78.p_ = (reader_all *)pVar5.p_;
      atomic_counter::inc((atomic_counter *)this_01);
      local_70.super_buffer_impl<char_*>._0_8_ = pVar5.p_;
      atomic_counter::inc((atomic_counter *)this_01);
      basic_io_device::on_readable(this_00,(event_handler *)&local_70);
      intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
                ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_70);
      intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr(&local_78);
    }
    intrusive_ptr<booster::aio::(anonymous_namespace)::reader_all>::~intrusive_ptr(&local_80);
    return;
  }
  return;
}

Assistant:

void stream_socket::async_read(mutable_buffer const &buffer,io_handler const &h)
{
	if(!dont_block(h))
		return;
	reader_all::pointer r(new reader_all(this,buffer,h));
	r->run();
}